

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

block * gen_byteop(compiler_state_t *cstate,int op,int idx,int val)

{
  slist *psVar1;
  block *pbVar2;
  int iVar3;
  
  if (op < 0x3d) {
    if (op == 0x26) {
      iVar3 = 0x54;
LAB_0010f7f7:
      psVar1 = (slist *)newchunk(cstate,0x28);
      (psVar1->s).code = iVar3;
      (psVar1->s).k = val;
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x15;
      pbVar2->head = pbVar2;
      pbVar2->stmts = psVar1;
    }
    else {
      if (op != 0x3c) {
LAB_0010f842:
        abort();
      }
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,idx,0x10);
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x35;
      pbVar2->head = pbVar2;
      pbVar2->stmts = psVar1;
      (pbVar2->s).k = val;
    }
    pbVar2->sense = (uint)(pbVar2->sense == 0);
  }
  else {
    if (op == 0x3d) {
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,idx,0x10);
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x15;
    }
    else {
      if (op != 0x3e) {
        iVar3 = 0x44;
        if (op != 0x7c) goto LAB_0010f842;
        goto LAB_0010f7f7;
      }
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,idx,0x10);
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x25;
    }
    pbVar2->head = pbVar2;
    pbVar2->stmts = psVar1;
    (pbVar2->s).k = val;
  }
  return pbVar2;
}

Assistant:

struct block *
gen_byteop(compiler_state_t *cstate, int op, int idx, int val)
{
	struct block *b;
	struct slist *s;

	switch (op) {
	default:
		abort();

	case '=':
		return gen_cmp(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);

	case '<':
		b = gen_cmp_lt(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);
		return b;

	case '>':
		b = gen_cmp_gt(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);
		return b;

	case '|':
		s = new_stmt(cstate, BPF_ALU|BPF_OR|BPF_K);
		break;

	case '&':
		s = new_stmt(cstate, BPF_ALU|BPF_AND|BPF_K);
		break;
	}
	s->s.k = val;
	b = new_block(cstate, JMP(BPF_JEQ));
	b->stmts = s;
	gen_not(b);

	return b;
}